

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void hash_table_set(char *name,size_t val,hash_table_t *hash_table)

{
  int iVar1;
  unsigned_long hash_00;
  hash_table_entry_t *phVar2;
  hash_table_entry_t *entry;
  unsigned_long hash;
  hash_table_t *hash_table_local;
  size_t val_local;
  char *name_local;
  
  hash_00 = hash_djb2((uchar *)name);
  phVar2 = hash_table_find(hash_00,hash_table);
  if (phVar2 == (hash_table_entry_t *)0x0) {
    do {
      hash_table_maybe_grow(hash_table->n + 1,hash_table);
      iVar1 = hash_table_insert(hash_00,val,hash_table);
    } while (iVar1 != 0);
  }
  else {
    phVar2->value = val;
  }
  return;
}

Assistant:

static void hash_table_set(const char* name, size_t val, hash_table_t* hash_table)
{
  /* Hash name */
  unsigned long hash = hash_djb2((const unsigned char *)name);

  hash_table_entry_t* entry = hash_table_find(hash, hash_table);
  if (entry)
  {
    entry->value = (long)val;
    return;
  }

  /* Expand if necessary
   * Grow until the element has been added
   */
  do
  {
    hash_table_maybe_grow(hash_table->n + 1, hash_table);
  }
  while (hash_table_insert(hash, (long)val, hash_table) != HASH_TABLE_SUCCESS);
}